

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onconnect.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  epoll_event ev;
  sigset_t sw;
  sigset_t all;
  undefined1 local_12c [140];
  sigset_t local_a0;
  
  cfg.prog = *argv;
  cfg.pid = getpid();
  while( true ) {
    while( true ) {
      iVar1 = getopt(argc,argv,"vp:a:h");
      if (iVar1 < 0x70) break;
      if (iVar1 == 0x70) {
        cfg.port = atoi(_optarg);
      }
      else {
        if (iVar1 != 0x76) goto LAB_00101d93;
        cfg.verbose = cfg.verbose + 1;
      }
    }
    if (iVar1 != 0x61) break;
    cfg.addr = inet_addr(_optarg);
  }
  if (iVar1 == -1) {
    if (cfg.addr != 0xffffffff) {
      if (cfg.port != 0) {
        cfg.subprocess_argv = argv + _optind;
        cfg.subprocess_argc = argc - _optind;
        if (0 < cfg.subprocess_argc && cfg.verbose != 0) {
          main_cold_1();
        }
        sigfillset(&local_a0);
        lVar2 = 0;
        sigprocmask(2,&local_a0,(sigset_t *)0x0);
        sigemptyset((sigset_t *)(local_12c + 0xc));
        do {
          sigaddset((sigset_t *)(local_12c + 0xc),*(int *)((long)sigs + lVar2));
          lVar2 = lVar2 + 4;
        } while (lVar2 != 0x1c);
        iVar1 = setup_listener();
        if (iVar1 == 0) {
          cfg.signal_fd = signalfd(-1,(sigset_t *)(local_12c + 0xc),0);
          if (cfg.signal_fd == -1) {
            main_cold_5();
          }
          else {
            cfg.epoll_fd = epoll_create(1);
            if (cfg.epoll_fd == -1) {
              main_cold_4();
            }
            else {
              iVar1 = add_epoll(1,cfg.listener_fd);
              if (iVar1 == 0) {
                iVar1 = add_epoll(1,cfg.signal_fd);
                if (iVar1 == 0) {
                  alarm(1);
                  iVar1 = epoll_wait(cfg.epoll_fd,(epoll_event *)local_12c,1,-1);
                  if (0 < iVar1) {
                    do {
                      if (local_12c._4_4_ == cfg.signal_fd) {
                        iVar1 = handle_signal();
                      }
                      else {
                        if (local_12c._4_4_ != cfg.listener_fd) {
                          main_cold_2();
                          goto LAB_00101d4b;
                        }
                        iVar1 = accept_client();
                      }
                      if (iVar1 < 0) goto LAB_00101d4b;
                      iVar1 = epoll_wait(cfg.epoll_fd,(epoll_event *)local_12c,1,-1);
                    } while (0 < iVar1);
                  }
                  main_cold_3();
                }
              }
            }
          }
        }
LAB_00101d4b:
        if (cfg.listener_fd != -1) {
          close(cfg.listener_fd);
        }
        if (cfg.epoll_fd != -1) {
          close(cfg.epoll_fd);
        }
        if (cfg.signal_fd != -1) {
          close(cfg.signal_fd);
        }
        return 0;
      }
      goto LAB_00101d9d;
    }
  }
  else {
LAB_00101d93:
    main_cold_8();
  }
  main_cold_7();
LAB_00101d9d:
  main_cold_6();
  halt_baddata();
}

Assistant:

int main(int argc, char *argv[]) {
  cfg.prog = argv[0];
  cfg.prog=argv[0];
  cfg.pid = getpid();
  int n, opt, sc;
  struct epoll_event ev;

  while ( (opt=getopt(argc,argv,"vp:a:h")) != -1) {
    switch(opt) {
      case 'v': cfg.verbose++; break;
      case 'p': cfg.port=atoi(optarg); break; 
      case 'a': cfg.addr=inet_addr(optarg); break; 
      case 'h': default: usage(); break;
    }
  }
  if (cfg.addr == INADDR_NONE) usage();
  if (cfg.port==0) usage();
  /* advance argv/argc to subprocess name and arguments */
  cfg.subprocess_argv = argv + optind;
  cfg.subprocess_argc = argc - optind;
  if (cfg.verbose) {
    for(n = 0; n < cfg.subprocess_argc; n++) {
      fprintf(stderr, "subprocess: argv[%d]: %s\n", n, cfg.subprocess_argv[n]);
    }
  }

  /* block all signals. we take signals synchronously via signalfd */
  sigset_t all;
  sigfillset(&all);
  sigprocmask(SIG_SETMASK,&all,NULL);

  /* a few signals we'll accept via our signalfd */
  sigset_t sw;
  sigemptyset(&sw);
  for(n=0; n < sizeof(sigs)/sizeof(*sigs); n++) sigaddset(&sw, sigs[n]);

  if (setup_listener()) goto done;

  /* create the signalfd for receiving signals */
  cfg.signal_fd = signalfd(-1, &sw, 0);
  if (cfg.signal_fd == -1) {
    fprintf(stderr,"signalfd: %s\n", strerror(errno));
    goto done;
  }

  /* set up the epoll instance */
  cfg.epoll_fd = epoll_create(1); 
  if (cfg.epoll_fd == -1) {
    fprintf(stderr,"epoll: %s\n", strerror(errno));
    goto done;
  }

  /* add descriptors of interest */
  if (add_epoll(EPOLLIN, cfg.listener_fd)) goto done;
  if (add_epoll(EPOLLIN, cfg.signal_fd)) goto done;

  /*
   * This is our main loop. epoll for input or signals.
   */
  alarm(1);
  while (epoll_wait(cfg.epoll_fd, &ev, 1, -1) > 0) {

    if (ev.data.fd == cfg.signal_fd) { 
      sc = handle_signal();
      if (sc < 0) goto done;
    }
    else if (ev.data.fd == cfg.listener_fd) { 
      sc = accept_client();
      if (sc < 0) goto done;
    }
    else {
      fprintf(stderr, "Unexpected file descriptor from epoll\n");
      goto done;
    }
  }

  fprintf(stderr, "epoll_wait: %s\n", strerror(errno));

 done:   /* we get here if we got a signal like Ctrl-C */
  if (cfg.listener_fd != -1) close(cfg.listener_fd);
  if (cfg.epoll_fd != -1) close(cfg.epoll_fd);
  if (cfg.signal_fd != -1) close(cfg.signal_fd);
  return 0;
}